

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::BufferVkImpl::InvalidateMappedRange(BufferVkImpl *this,Uint64 StartOffset,Uint64 Size)

{
  VulkanPhysicalDevice *pVVar1;
  VkDeviceSize VVar2;
  RenderDeviceVkImpl *pRVar3;
  char (*in_R8) [23];
  element_type *this_00;
  string msg;
  VkMappedMemoryRange MappedRange;
  ulong local_88;
  string local_80;
  element_type *local_60;
  VkMappedMemoryRange local_58;
  
  BufferBase<Diligent::EngineVkImplTraits>::DvpVerifyInvalidateMappedRangeArguments
            (&this->super_BufferBase<Diligent::EngineVkImplTraits>,StartOffset,Size);
  pRVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  this_00 = (pRVar3->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  pRVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)this);
  pVVar1 = (pRVar3->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  local_58.pNext = (void *)0x0;
  local_58.offset = 0;
  local_58.size = 0;
  local_58.sType = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  local_58._4_4_ = 0;
  local_58.memory = (((this->m_MemoryAllocation).Page)->m_VkMemory).m_VkObject;
  VVar2 = this->m_BufferMemoryAlignedOffset;
  local_88 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x1f0);
  if ((local_88 ^ local_88 - 1) <= local_88 - 1) {
    local_60 = this_00;
    FormatString<char[12],unsigned_long,char[23]>
              (&local_80,(Diligent *)"Alignment (",(char (*) [12])&local_88,
               (unsigned_long *)") must be a power of 2",in_R8);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"AlignDown",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x45);
    this_00 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      this_00 = local_60;
    }
  }
  local_58.offset = VVar2 + StartOffset & -local_88;
  VVar2 = this->m_BufferMemoryAlignedOffset;
  local_88 = *(VkDeviceSize *)((long)&(pVVar1->m_Properties).limits + 0x1f0);
  if ((local_88 ^ local_88 - 1) <= local_88 - 1) {
    FormatString<char[12],unsigned_long,char[23]>
              (&local_80,(Diligent *)"Alignment (",(char (*) [12])&local_88,
               (unsigned_long *)") must be a power of 2",in_R8);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"AlignUp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/Align.hpp"
               ,0x34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  local_58.size = (-local_88 & (local_88 + StartOffset + Size + VVar2) - 1) - local_58.offset;
  VulkanUtilities::VulkanLogicalDevice::InvalidateMappedMemoryRanges(this_00,1,&local_58);
  return;
}

Assistant:

void BufferVkImpl::InvalidateMappedRange(Uint64 StartOffset, Uint64 Size)
{
    DvpVerifyInvalidateMappedRangeArguments(StartOffset, Size);

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = GetDevice()->GetLogicalDevice();
    const VkPhysicalDeviceLimits&               DeviceLimits  = GetDevice()->GetPhysicalDevice().GetProperties().limits;

    VkMappedMemoryRange MappedRange{};
    MappedRange.sType  = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
    MappedRange.memory = m_MemoryAllocation.Page->GetVkMemory();
    MappedRange.offset = AlignDown(m_BufferMemoryAlignedOffset + StartOffset, DeviceLimits.nonCoherentAtomSize);
    MappedRange.size   = AlignUp(m_BufferMemoryAlignedOffset + StartOffset + Size, DeviceLimits.nonCoherentAtomSize) - MappedRange.offset;
    LogicalDevice.InvalidateMappedMemoryRanges(1, &MappedRange);
}